

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void __thiscall libchars::debug::~debug(debug *this)

{
  if (_d_ != (FILE *)0x0) {
    fclose(_d_);
    _d_ = (FILE *)0x0;
  }
  std::__cxx11::string::~string((string *)&this->log_path);
  return;
}

Assistant:

debug::~debug()
    {
        if (_d_ != NULL) {
            fclose(_d_);
            _d_ = NULL;
        }
    }